

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaCheckUnionTypeDefCircularRecur
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaTypePtr ctxType,xmlSchemaTypeLinkPtr members)

{
  int iVar1;
  xmlSchemaTypeLinkPtr members_00;
  bool bVar2;
  xmlSchemaTypePtr pxStack_38;
  int res;
  xmlSchemaTypePtr memberType;
  xmlSchemaTypeLinkPtr member;
  xmlSchemaTypeLinkPtr members_local;
  xmlSchemaTypePtr ctxType_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  memberType = (xmlSchemaTypePtr)members;
  do {
    if (memberType == (xmlSchemaTypePtr)0x0) {
      return 0;
    }
    pxStack_38 = memberType->next;
    while( true ) {
      bVar2 = false;
      if (pxStack_38 != (xmlSchemaTypePtr)0x0) {
        bVar2 = pxStack_38->type != XML_SCHEMA_TYPE_BASIC;
      }
      if (!bVar2) break;
      if (pxStack_38 == ctxType) {
        xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_SRC_SIMPLE_TYPE_4,(xmlSchemaBasicItemPtr)ctxType,
                            (xmlNodePtr)0x0,"The union type definition is circular",(xmlChar *)0x0);
        return 0xbbb;
      }
      if (((pxStack_38->flags & 0x80U) != 0) && ((pxStack_38->flags & 0x10000U) == 0)) {
        pxStack_38->flags = pxStack_38->flags | 0x10000;
        members_00 = xmlSchemaGetUnionSimpleTypeMemberTypes(pxStack_38);
        iVar1 = xmlSchemaCheckUnionTypeDefCircularRecur(pctxt,ctxType,members_00);
        pxStack_38->flags = pxStack_38->flags ^ 0x10000;
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      pxStack_38 = pxStack_38->baseType;
    }
    memberType = *(xmlSchemaTypePtr *)memberType;
  } while( true );
}

Assistant:

static int
xmlSchemaCheckUnionTypeDefCircularRecur(xmlSchemaParserCtxtPtr pctxt,
					xmlSchemaTypePtr ctxType,
					xmlSchemaTypeLinkPtr members)
{
    xmlSchemaTypeLinkPtr member;
    xmlSchemaTypePtr memberType;

    member = members;
    while (member != NULL) {
	memberType = member->type;
	while ((memberType != NULL) &&
	    (memberType->type != XML_SCHEMA_TYPE_BASIC)) {
	    if (memberType == ctxType) {
		xmlSchemaPCustomErr(pctxt,
		    XML_SCHEMAP_SRC_SIMPLE_TYPE_4,
		    WXS_BASIC_CAST ctxType, NULL,
		    "The union type definition is circular", NULL);
		return (XML_SCHEMAP_SRC_SIMPLE_TYPE_4);
	    }
	    if ((WXS_IS_UNION(memberType)) &&
		((memberType->flags & XML_SCHEMAS_TYPE_MARKED) == 0))
	    {
		int res;
		memberType->flags |= XML_SCHEMAS_TYPE_MARKED;
		res = xmlSchemaCheckUnionTypeDefCircularRecur(pctxt,
		    ctxType,
		    xmlSchemaGetUnionSimpleTypeMemberTypes(memberType));
		memberType->flags ^= XML_SCHEMAS_TYPE_MARKED;
		if (res != 0)
		    return(res);
	    }
	    memberType = memberType->baseType;
	}
	member = member->next;
    }
    return(0);
}